

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

void __thiscall Fl_Class_Type::write_code1(Fl_Class_Type *this)

{
  char *pcVar1;
  
  this->parent_class = current_class;
  current_class = this;
  this->write_public_state = '\0';
  write_h("\n");
  Fl_Type::write_comment_h(&this->super_Fl_Type,"");
  pcVar1 = this->class_prefix;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    write_h("class %s ",(this->super_Fl_Type).name_);
  }
  else {
    write_h("class %s %s ",pcVar1,(this->super_Fl_Type).name_);
  }
  if (this->subclass_of != (char *)0x0) {
    write_h(": %s ");
  }
  write_h("{\n");
  return;
}

Assistant:

void Fl_Class_Type::write_code1() {
  parent_class = current_class;
  current_class = this;
  write_public_state = 0;
  write_h("\n");
  write_comment_h();
  if (prefix() && strlen(prefix()))
    write_h("class %s %s ", prefix(), name());
  else
    write_h("class %s ", name());
  if (subclass_of) write_h(": %s ", subclass_of);
  write_h("{\n");
}